

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5HighlightFunction
               (Fts5ExtensionApi *pApi,Fts5Context *pFts,sqlite3_context *pCtx,int nVal,
               sqlite3_value **apVal)

{
  int errCode;
  i64 iVar1;
  int rc;
  HighlightContext ctx;
  
  if (nVal == 3) {
    iVar1 = sqlite3VdbeIntValue(*apVal);
    ctx.iter.pApi = (Fts5ExtensionApi *)0x0;
    ctx.iter.pFts = (Fts5Context *)0x0;
    ctx.iter.iCol = 0;
    ctx.iter.iInst = 0;
    ctx.iter.nInst = 0;
    ctx.iter.iStart = 0;
    ctx.iter.iEnd = 0;
    ctx.iter._36_4_ = 0;
    ctx.iPos = 0;
    ctx.iRangeStart = 0;
    ctx.iRangeEnd = 0;
    ctx._52_4_ = 0;
    ctx.zOpen = (char *)0x0;
    ctx.zClose = (char *)0x0;
    ctx.zIn = (char *)0x0;
    ctx.nIn = 0;
    ctx.iOff = 0;
    ctx.zOut = (char *)0x0;
    ctx.zOpen = (char *)sqlite3_value_text(apVal[1]);
    ctx.zClose = (char *)sqlite3_value_text(apVal[2]);
    errCode = (*pApi->xColumnText)(pFts,(int)iVar1,&ctx.zIn,&ctx.nIn);
    rc = errCode;
    if (ctx.zIn != (char *)0x0) {
      if (errCode == 0) {
        rc = fts5CInstIterInit(pApi,pFts,(int)iVar1,&ctx.iter);
        if (rc == 0) {
          rc = (*pApi->xTokenize)(pFts,ctx.zIn,ctx.nIn,&ctx,fts5HighlightCb);
        }
      }
      fts5HighlightAppend(&rc,&ctx,ctx.zIn + ctx.iOff,ctx.nIn - ctx.iOff);
      errCode = rc;
      if (rc == 0) {
        sqlite3_result_text(pCtx,ctx.zOut,-1,(_func_void_void_ptr *)0xffffffffffffffff);
      }
      sqlite3_free(ctx.zOut);
    }
    if (errCode != 0) {
      sqlite3_result_error_code(pCtx,errCode);
    }
    return;
  }
  sqlite3_result_error(pCtx,"wrong number of arguments to function highlight()",-1);
  return;
}

Assistant:

static void fts5HighlightFunction(
  const Fts5ExtensionApi *pApi,   /* API offered by current FTS version */
  Fts5Context *pFts,              /* First arg to pass to pApi functions */
  sqlite3_context *pCtx,          /* Context for returning result/error */
  int nVal,                       /* Number of values in apVal[] array */
  sqlite3_value **apVal           /* Array of trailing arguments */
){
  HighlightContext ctx;
  int rc;
  int iCol;

  if( nVal!=3 ){
    const char *zErr = "wrong number of arguments to function highlight()";
    sqlite3_result_error(pCtx, zErr, -1);
    return;
  }

  iCol = sqlite3_value_int(apVal[0]);
  memset(&ctx, 0, sizeof(HighlightContext));
  ctx.zOpen = (const char*)sqlite3_value_text(apVal[1]);
  ctx.zClose = (const char*)sqlite3_value_text(apVal[2]);
  rc = pApi->xColumnText(pFts, iCol, &ctx.zIn, &ctx.nIn);

  if( ctx.zIn ){
    if( rc==SQLITE_OK ){
      rc = fts5CInstIterInit(pApi, pFts, iCol, &ctx.iter);
    }

    if( rc==SQLITE_OK ){
      rc = pApi->xTokenize(pFts, ctx.zIn, ctx.nIn, (void*)&ctx,fts5HighlightCb);
    }
    fts5HighlightAppend(&rc, &ctx, &ctx.zIn[ctx.iOff], ctx.nIn - ctx.iOff);

    if( rc==SQLITE_OK ){
      sqlite3_result_text(pCtx, (const char*)ctx.zOut, -1, SQLITE_TRANSIENT);
    }
    sqlite3_free(ctx.zOut);
  }
  if( rc!=SQLITE_OK ){
    sqlite3_result_error_code(pCtx, rc);
  }
}